

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Platform.h
# Opt level: O0

bool senjo::NumberParam<int>(string *name,int *value,char **params,bool *invalid)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  bool *invalid_local;
  char **params_local;
  int *value_local;
  string *name_local;
  
  bVar2 = ParamMatch(name,params);
  if (bVar2) {
    if (((*params == (char *)0x0) || (**params == '\0')) ||
       (iVar3 = isdigit((int)**params), iVar3 == 0)) {
      *invalid = true;
    }
    else {
      pcVar1 = *params;
      *params = pcVar1 + 1;
      *value = *pcVar1 + -0x30;
      while( true ) {
        bVar2 = false;
        if (**params != '\0') {
          iVar3 = isdigit((int)**params);
          bVar2 = iVar3 != 0;
        }
        if (!bVar2) break;
        iVar3 = *value;
        pcVar1 = *params;
        *params = pcVar1 + 1;
        *value = iVar3 * 10 + *pcVar1 + -0x30;
      }
      if ((**params == '\0') || (iVar3 = isspace((int)**params), iVar3 != 0)) {
        NextWord(params);
      }
      else {
        *invalid = true;
      }
    }
    name_local._7_1_ = true;
  }
  else {
    name_local._7_1_ = false;
  }
  return name_local._7_1_;
}

Assistant:

static inline bool NumberParam(const std::string& name, Number& value,
                               const char*& params, bool& invalid)
{
  if (!ParamMatch(name, params)) {
    return false;
  }
  if (!params || !*params || !isdigit(*params)) {
    invalid = true;
  }
  else {
    value = (*params++ - '0');
    while (*params && isdigit(*params)) {
      value = ((10 * value) + (*params++ - '0'));
    }
    if (*params && !isspace(*params)) {
      invalid = true;
    }
    else {
      NextWord(params);
    }
  }
  return true;
}